

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_d47da::____C_A_T_C_H____T_E_S_T____22::test(____C_A_T_C_H____T_E_S_T____22 *this)

{
  _Atomic_word *p_Var1;
  ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Atomic_word _Var2;
  Family id;
  EventSignalPtr *pEVar3;
  size_t sVar4;
  int iVar5;
  EventCallbackWrapper<entityx::EntityCreatedEvent> wrapper;
  EntityCreatedEventReceiver receiver;
  _Any_data local_128;
  _Manager_type local_118;
  _Invoker_type local_110;
  char *local_108;
  size_type local_100;
  Flags local_f8;
  AssertionReaction local_f0;
  bool local_ee;
  IResultCapture *local_e8;
  _Any_data local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  size_t local_c8;
  long local_c0;
  undefined1 local_b8 [9];
  undefined7 uStack_af;
  _Any_data *local_a8;
  _Invoker_type p_Stack_a0;
  undefined8 local_98;
  long *local_90;
  undefined1 local_88 [8];
  __node_base_ptr *local_80;
  size_type local_78;
  __node_base local_70;
  size_type sStack_68;
  float local_60;
  size_t local_58;
  __node_base_ptr p_Stack_50;
  void *local_48;
  long lStack_40;
  undefined8 local_38;
  
  local_80 = &p_Stack_50;
  local_78 = 1;
  local_70._M_nxt = (_Hash_node_base *)0x0;
  sStack_68 = 0;
  local_60 = 1.0;
  local_58 = 0;
  p_Stack_50 = (__node_base_ptr)0x0;
  local_88 = (undefined1  [8])&PTR__EntityCreatedEventReceiver_001f12d0;
  local_48 = (void *)0x0;
  lStack_40 = 0;
  local_38 = 0;
  id = entityx::Event<entityx::EntityCreatedEvent>::family();
  pEVar3 = entityx::EventManager::signal_for((EventManager *)this,id);
  this_00 = &((pEVar3->
              super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr)->
             super_ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>;
  this_01 = (pEVar3->
            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_b8._0_8_ = (void *)0x0;
  stack0xffffffffffffff50 = 0;
  local_a8 = (_Any_data *)0x0;
  p_Stack_a0 = (_Invoker_type)0x0;
  local_b8._0_8_ = operator_new(0x18);
  *(code **)local_b8._0_8_ =
       (anonymous_namespace)::____C_A_T_C_H____T_E_S_T____22::test()::EntityCreatedEventReceiver::
       receive(entityx::EntityCreatedEvent_const__;
  *(undefined8 *)(local_b8._0_8_ + 8) = 0;
  *(undefined1 **)(local_b8._0_8_ + 0x10) = local_88;
  p_Stack_a0 = Catch::clara::std::
               _Function_handler<void_(const_entityx::EntityCreatedEvent_&),_std::_Bind<void_(EntityCreatedEventReceiver::*(EntityCreatedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityCreatedEvent_&)>_>
               ::_M_invoke;
  local_a8 = (_Any_data *)
             Catch::clara::std::
             _Function_handler<void_(const_entityx::EntityCreatedEvent_&),_std::_Bind<void_(EntityCreatedEventReceiver::*(EntityCreatedEventReceiver_*,_std::_Placeholder<1>))(const_entityx::EntityCreatedEvent_&)>_>
             ::_M_manager;
  Catch::clara::std::function<void_(const_entityx::EntityCreatedEvent_&)>::function
            ((function<void_(const_entityx::EntityCreatedEvent_&)> *)&local_128,
             (function<void_(const_entityx::EntityCreatedEvent_&)> *)local_b8);
  if (local_a8 != (_Any_data *)0x0) {
    (*(code *)local_a8)((_Any_data *)local_b8,(_Any_data *)local_b8,__destroy_functor);
  }
  std::function<void(void_const*)>::
  function<entityx::EventManager::EventCallbackWrapper<entityx::EntityCreatedEvent>&,void>
            ((function<void(void_const*)> *)local_e0._M_pod_data,
             (EventCallbackWrapper<entityx::EntityCreatedEvent> *)&local_128);
  Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::ensure_ring
            (this_00);
  sVar4 = Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::
          SignalLink::add_before(this_00->callback_ring_,(CbFunction *)&local_e0);
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (*(code *)local_d0)(&local_e0,&local_e0,__destroy_functor);
  }
  local_e0._M_unused._M_member_pointer = entityx::Event<entityx::EntityCreatedEvent>::family();
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_weak_count = this_01->_M_weak_count + 1;
    }
  }
  local_e0._8_8_ = this_00;
  local_d0 = this_01;
  local_c8 = sVar4;
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_emplace<std::pair<unsigned_long,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>,std::allocator<std::pair<unsigned_long_const,std::pair<std::weak_ptr<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>,unsigned_long>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_80,&local_e0);
  if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &local_d0->_M_weak_count;
      _Var2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      _Var2 = local_d0->_M_weak_count;
      local_d0->_M_weak_count = _Var2 + -1;
    }
    if (_Var2 == 1) {
      (*local_d0->_vptr__Sp_counted_base[3])();
    }
  }
  if (local_118 != (code *)0x0) {
    (*local_118)(&local_128,&local_128,__destroy_functor);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  local_128._M_unused._M_object = "REQUIRE";
  local_128._8_8_ = 7;
  local_118 = (_Manager_type)0x1c58b5;
  local_110 = (_Invoker_type)0x135;
  local_108 = "0UL == receiver.created.size()";
  local_100 = 0x1e;
  local_f8 = 1;
  local_f0.shouldDebugBreak = false;
  local_f0.shouldThrow = false;
  local_ee = false;
  local_e8 = Catch::getResultCapture();
  local_e0._M_unused._M_object = (void *)0x0;
  uStack_af._0_1_ = lStack_40 - (long)local_48 == 0;
  local_c0 = lStack_40 - (long)local_48 >> 4;
  local_b8[8] = 1;
  local_b8._0_8_ = &PTR_streamReconstructedExpression_001f36a0;
  p_Stack_a0 = (_Invoker_type)0x1c63fd;
  local_98 = 2;
  local_a8 = &local_e0;
  local_90 = &local_c0;
  (*local_e8->_vptr_IResultCapture[10])(local_e8,&local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_128);
  if (local_ee == false) {
    (*local_e8->_vptr_IResultCapture[0xe])();
  }
  iVar5 = 10;
  do {
    entityx::EntityManager::create(&(this->super_EntityManagerFixture).em);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  local_128._M_unused._M_object = "REQUIRE";
  local_128._8_8_ = 7;
  local_118 = (_Manager_type)0x1c58b5;
  local_110 = (_Invoker_type)0x139;
  local_108 = "10UL == receiver.created.size()";
  local_100 = 0x1f;
  local_f8 = 1;
  local_f0.shouldDebugBreak = false;
  local_f0.shouldThrow = false;
  local_ee = false;
  local_e8 = Catch::getResultCapture();
  local_c0 = lStack_40 - (long)local_48 >> 4;
  uStack_af._0_1_ = lStack_40 - (long)local_48 == 0xa0;
  local_b8[8] = 1;
  local_e0._M_unused._M_member_pointer = 10;
  local_b8._0_8_ = &PTR_streamReconstructedExpression_001f36a0;
  p_Stack_a0 = (_Invoker_type)0x1c63fd;
  local_98 = 2;
  local_a8 = &local_e0;
  local_90 = &local_c0;
  (*local_e8->_vptr_IResultCapture[10])(local_e8,&local_128);
  Catch::AssertionHandler::complete((AssertionHandler *)&local_128);
  if (local_ee == false) {
    (*local_e8->_vptr_IResultCapture[0xe])();
  }
  local_88 = (undefined1  [8])&PTR__EntityCreatedEventReceiver_001f12d0;
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  entityx::BaseReceiver::~BaseReceiver((BaseReceiver *)local_88);
  return;
}

Assistant:

void receive(const EntityCreatedEvent &event) {
      created.push_back(event.entity);
    }